

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepTiledOutputFile::setFrameBuffer(DeepTiledOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  byte bVar1;
  byte bVar2;
  pthread_mutex_t *__mutex;
  size_t sVar3;
  double dVar4;
  size_t sVar5;
  bool bVar6;
  PixelType PVar7;
  undefined4 uVar8;
  undefined8 __src;
  undefined8 uVar9;
  int iVar10;
  ChannelList *this_00;
  const_iterator cVar11;
  ConstIterator CVar12;
  ConstIterator CVar13;
  const_iterator cVar14;
  Slice *pSVar15;
  pointer ppTVar16;
  ArgExc *pAVar17;
  ostream *poVar18;
  char *pcVar19;
  size_t sVar20;
  ulong uVar21;
  DeepFrameBuffer *__n;
  pointer ppTVar22;
  Data *pDVar23;
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  slices;
  value_type local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar10 = pthread_mutex_lock(__mutex);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  this_00 = Header::channels(&this->_data->header);
  for (cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00); CVar12 = ChannelList::end(this_00),
      (const_iterator)cVar11._M_node != CVar12._i._M_node;
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
    CVar13 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node != (const_iterator)cVar14._M_node) {
      if (cVar11._M_node[9]._M_color != *(_Rb_tree_color *)((long)CVar13._i._M_node + 0x120)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Pixel type of \"",0xf);
        poVar18 = std::operator<<((ostream *)&local_1a8,(char *)(cVar11._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" channel of output file \"",0x1a);
        pcVar19 = OStream::fileName(this->_data->_streamData->os);
        poVar18 = std::operator<<(poVar18,pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" is not compatible with the frame buffer\'s pixel type.",0x37);
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar17,(stringstream *)local_1b8);
        __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if ((*(int *)((long)CVar13._i._M_node + 0x140) != 1) ||
         (*(int *)((long)CVar13._i._M_node + 0x144) != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"All channels in a tiled file must havesampling (1,1).",
                   0x35);
        pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar17,(stringstream *)local_1b8);
        __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
  }
  pSVar15 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
  if (pSVar15->base == (char *)0x0) {
    pAVar17 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar17,"Invalid base pointer, please set a proper sample count slice.")
    ;
    __cxa_throw(pAVar17,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  pDVar23 = this->_data;
  pDVar23->sampleCountSliceBase = pSVar15->base;
  sVar5 = pSVar15->yStride;
  pDVar23->sampleCountXStride = (int)pSVar15->xStride;
  pDVar23->sampleCountYStride = (int)sVar5;
  pDVar23->sampleCountXTileCoords = (uint)pSVar15->xTileCoords;
  pDVar23->sampleCountYTileCoords = (uint)pSVar15->yTileCoords;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (pointer)0x0;
  cVar11._M_node = (_Base_ptr)ChannelList::begin(this_00);
  for (; CVar12 = ChannelList::end(this_00), (const_iterator)cVar11._M_node != CVar12._i._M_node;
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node)) {
    CVar13 = DeepFrameBuffer::find(frameBuffer,(char *)(cVar11._M_node + 1));
    cVar14._M_node = (_Base_ptr)DeepFrameBuffer::end(frameBuffer);
    if (CVar13._i._M_node == (const_iterator)cVar14._M_node) {
      local_1c0 = (value_type)operator_new(0x38);
      local_1c0->type = cVar11._M_node[9]._M_color;
      local_1c0->sampleStride = 0;
      local_1c0->xStride = 0;
      local_1c0->yStride = 0;
      local_1c0->zero = true;
      local_1c0->xTileCoords = 0;
      local_1c0->yTileCoords = 0;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
    }
    else {
      local_1c0 = (value_type)operator_new(0x38);
      iVar10 = *(int *)((long)CVar13._i._M_node + 0x154);
      bVar1 = *(byte *)((long)CVar13._i._M_node + 0x150);
      bVar2 = *(byte *)((long)CVar13._i._M_node + 0x151);
      local_1c0->type = *(PixelType *)((long)CVar13._i._M_node + 0x120);
      local_1c0->sampleStride = (long)iVar10;
      sVar5 = *(size_t *)((long)CVar13._i._M_node + 0x138);
      local_1c0->xStride = *(size_t *)((long)CVar13._i._M_node + 0x130);
      local_1c0->yStride = sVar5;
      local_1c0->zero = false;
      local_1c0->xTileCoords = (uint)bVar1;
      local_1c0->yTileCoords = (uint)bVar2;
      std::
      vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
      ::push_back((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   *)local_1b8,&local_1c0);
      (*(pointer)(local_1b8._8_8_ + -8))->base = *(char **)((long)CVar13._i._M_node + 0x128);
    }
  }
  pDVar23 = this->_data;
  __n = frameBuffer;
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&pDVar23->frameBuffer,
              (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)frameBuffer);
  bVar6 = (frameBuffer->_sampleCounts).yTileCoords;
  (pDVar23->frameBuffer)._sampleCounts.xTileCoords = (frameBuffer->_sampleCounts).xTileCoords;
  (pDVar23->frameBuffer)._sampleCounts.yTileCoords = bVar6;
  PVar7 = (frameBuffer->_sampleCounts).type;
  uVar8 = *(undefined4 *)&(frameBuffer->_sampleCounts).field_0x4;
  pcVar19 = (frameBuffer->_sampleCounts).base;
  sVar5 = (frameBuffer->_sampleCounts).xStride;
  sVar3 = (frameBuffer->_sampleCounts).yStride;
  iVar10 = (frameBuffer->_sampleCounts).ySampling;
  dVar4 = (frameBuffer->_sampleCounts).fillValue;
  (pDVar23->frameBuffer)._sampleCounts.xSampling = (frameBuffer->_sampleCounts).xSampling;
  (pDVar23->frameBuffer)._sampleCounts.ySampling = iVar10;
  (pDVar23->frameBuffer)._sampleCounts.fillValue = dVar4;
  (pDVar23->frameBuffer)._sampleCounts.xStride = sVar5;
  (pDVar23->frameBuffer)._sampleCounts.yStride = sVar3;
  (pDVar23->frameBuffer)._sampleCounts.type = PVar7;
  *(undefined4 *)&(pDVar23->frameBuffer)._sampleCounts.field_0x4 = uVar8;
  (pDVar23->frameBuffer)._sampleCounts.base = pcVar19;
  pDVar23 = this->_data;
  ppTVar22 = (pDVar23->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppTVar16 = (pDVar23->slices).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sVar20 = (long)ppTVar16 - (long)ppTVar22;
  if (sVar20 != 0) {
    uVar21 = 0;
    do {
      if (ppTVar22[uVar21] != (TOutSliceInfo *)0x0) {
        __n = (DeepFrameBuffer *)&DAT_00000038;
        operator_delete(ppTVar22[uVar21],0x38);
      }
      uVar21 = uVar21 + 1;
      pDVar23 = this->_data;
      ppTVar22 = (pDVar23->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar16 = (pDVar23->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      sVar20 = (long)ppTVar16 - (long)ppTVar22;
    } while (uVar21 < (ulong)((long)sVar20 >> 3));
  }
  __src = local_1b8._0_8_;
  uVar9 = local_1b8._8_8_;
  uVar21 = local_1b8._8_8_ - local_1b8._0_8_;
  if ((ulong)((long)(pDVar23->slices).
                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar22) < uVar21) {
    ppTVar16 = std::
               _Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
               ::_M_allocate((_Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                              *)((long)uVar21 >> 3),(size_t)__n);
    if (uVar9 != __src) {
      memcpy(ppTVar16,(void *)__src,uVar21);
    }
    ppTVar22 = (pDVar23->slices).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (ppTVar22 != (pointer)0x0) {
      operator_delete(ppTVar22,(long)(pDVar23->slices).
                                     super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppTVar22);
    }
    (pDVar23->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar16;
    (pDVar23->slices).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)ppTVar16 + uVar21);
  }
  else {
    if (sVar20 < uVar21) {
      if (ppTVar16 != ppTVar22) {
        memmove(ppTVar22,(void *)local_1b8._0_8_,sVar20);
      }
      ppTVar22 = (pDVar23->slices).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppTVar16 = (pointer)(((long)ppTVar22 -
                           (long)(pDVar23->slices).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + local_1b8._0_8_);
      sVar20 = local_1b8._8_8_ - (long)ppTVar16;
      if (sVar20 == 0) goto LAB_00169b5e;
    }
    else {
      sVar20 = uVar21;
      ppTVar16 = (pointer)local_1b8._0_8_;
      if (local_1b8._8_8_ == local_1b8._0_8_) goto LAB_00169b5e;
    }
    memmove(ppTVar22,ppTVar16,sVar20);
  }
LAB_00169b5e:
  (pDVar23->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(uVar21 + (long)(pDVar23->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledOutputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
            continue;

        if (i.channel().type != j.slice().type)
            THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" channel "
                                "of output file \"" << fileName() << "\" is "
                                "not compatible with the frame buffer's "
                                "pixel type.");

        if (j.slice().xSampling != 1 || j.slice().ySampling != 1)
            THROW (IEX_NAMESPACE::ArgExc, "All channels in a tiled file must have"
                                "sampling (1,1).");
    }

    //
    // Store the pixel sample count table.
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    //

    vector<TOutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name());

        if (j == frameBuffer.end())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new TOutSliceInfo (i.channel().type,
                                                 0, // sampleStride,
                                                 0, // xStride
                                                 0, // yStride
                                                 true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new TOutSliceInfo (j.slice().type,
                                                 j.slice().sampleStride,
                                                 j.slice().xStride,
                                                 j.slice().yStride,
                                                 false, // zero
                                                 (j.slice().xTileCoords)? 1: 0,
                                                 (j.slice().yTileCoords)? 1: 0));

            TOutSliceInfo* slice = slices.back();
            slice->base = j.slice().base;
            
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}